

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O2

uint32 google::protobuf::internal::ReadSize(char **pp)

{
  byte bVar1;
  byte *p;
  undefined1 auVar2 [12];
  pair<const_char_*,_int> pVar3;
  
  p = (byte *)*pp;
  bVar1 = *p;
  if ((char)bVar1 < '\0') {
    pVar3 = ReadSizeFallback((char *)p,(uint)bVar1);
    auVar2 = pVar3._0_12_;
  }
  else {
    auVar2[8] = bVar1;
    auVar2._0_8_ = p + 1;
    auVar2._9_3_ = 0;
  }
  *pp = auVar2._0_8_;
  return auVar2._8_4_;
}

Assistant:

inline uint32 ReadSize(const char** pp) {
  auto p = *pp;
  uint32 res = static_cast<uint8>(p[0]);
  if (res < 128) {
    *pp = p + 1;
    return res;
  }
  auto x = ReadSizeFallback(p, res);
  *pp = x.first;
  return x.second;
}